

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneField
          (MessageGenerator *this,Printer *printer,FieldDescriptor *field,int cached_has_bits_index)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  FieldGenerator *pFVar4;
  AlphaNum *a;
  AlphaNum *this_00;
  Hex hex;
  AlphaNum local_b0;
  string mask;
  Formatter format;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  bVar1 = *(byte *)(*(long *)(field + 0x38) + 0x4f);
  if (bVar1 == 0) {
    PrintFieldComment<google::protobuf::FieldDescriptor>(&format,field);
    bVar1 = *(byte *)(*(long *)(field + 0x38) + 0x4f);
  }
  if ((bVar1 & 1) == 0) {
    bVar2 = HasHasbit(field);
    if (bVar2) {
      iVar3 = HasBitIndex(this,field);
      if (iVar3 / 0x20 == cached_has_bits_index) {
        hex.value = (ulong)(uint)(1 << ((byte)iVar3 & 0x1f));
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum(&local_b0,hex);
        StrCat_abi_cxx11_(&mask,(protobuf *)&local_b0,a);
        Formatter::operator()(&format,"if (cached_has_bits & 0x$1$u) {\n",&mask);
        this_00 = (AlphaNum *)&mask;
      }
      else {
        FieldName_abi_cxx11_
                  ((string *)&local_b0,(cpp *)field,
                   (FieldDescriptor *)((long)iVar3 % 0x20 & 0xffffffff));
        Formatter::operator()
                  (&format,"if (_internal_has_$1$()) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
        this_00 = &local_b0;
      }
      std::__cxx11::string::~string((string *)this_00);
      bVar2 = true;
      io::Printer::Indent(format.printer_);
      goto LAB_002df7dd;
    }
    if (((byte)field[1] & 0x60) == 0x20) {
      bVar2 = HasHasbit(field);
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_b0,"this->",(allocator *)&mask);
        bVar2 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,(string *)&local_b0,field);
        std::__cxx11::string::~string((string *)&local_b0);
        goto LAB_002df7dd;
      }
    }
  }
  bVar2 = false;
LAB_002df7dd:
  pFVar4 = FieldGeneratorMap::get(&this->field_generators_,field);
  (*pFVar4->_vptr_FieldGenerator[0x13])(pFVar4,printer);
  if (bVar2 != false) {
    io::Printer::Outdent(format.printer_);
    Formatter::operator()<>(&format,"}\n");
  }
  Formatter::operator()<>(&format,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneField(io::Printer* printer,
                                                 const FieldDescriptor* field,
                                                 int cached_has_bits_index) {
  Formatter format(printer, variables_);
  if (!field->options().weak()) {
    // For weakfields, PrintFieldComment is called during iteration.
    PrintFieldComment(format, field);
  }

  bool have_enclosing_if = false;
  if (field->options().weak()) {
  } else if (HasHasbit(field)) {
    // Attempt to use the state of cached_has_bits, if possible.
    int has_bit_index = HasBitIndex(field);
    if (cached_has_bits_index == has_bit_index / 32) {
      const std::string mask =
          StrCat(strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));

      format("if (cached_has_bits & 0x$1$u) {\n", mask);
    } else {
      format("if (_internal_has_$1$()) {\n", FieldName(field));
    }

    format.Indent();
    have_enclosing_if = true;
  } else if (field->is_optional() && !HasHasbit(field)) {
    have_enclosing_if = EmitFieldNonDefaultCondition(printer, "this->", field);
  }

  field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(printer);

  if (have_enclosing_if) {
    format.Outdent();
    format("}\n");
  }
  format("\n");
}